

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O3

void __thiscall QWidgetItem::setGeometry(QWidgetItem *this,QRect *rect)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Representation RVar5;
  QSizePolicy QVar6;
  int iVar7;
  int iVar8;
  LayoutDirection direction;
  Alignment AVar9;
  uint uVar10;
  ulong uVar11;
  int extraout_var;
  int extraout_var_00;
  QSize QVar12;
  int extraout_var_01;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  Representation RVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar3 == '\0') {
    bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (bVar2) {
      uVar11._0_4_ = rect->x1;
      uVar11._4_4_ = rect->y1;
      uVar17._0_4_ = rect->x2;
      uVar17._4_4_ = rect->y2;
      uVar13 = uVar17._4_4_;
      uVar15 = uVar11._4_4_;
      uVar20 = (undefined4)uVar17;
      uVar23 = uVar17._4_4_;
      uVar14 = (undefined4)uVar11;
      uVar10 = uVar11._4_4_;
    }
    else {
      lVar1 = *(long *)&this->wid->field_0x8;
      uVar14 = (rect->x1).m_i;
      uVar11 = (ulong)uVar14;
      uVar10 = (rect->y1).m_i;
      uVar14 = (int)*(char *)(lVar1 + 0x1a0) + uVar14;
      uVar15 = (int)*(char *)(lVar1 + 0x1a1) + uVar10;
      uVar20 = (rect->x2).m_i;
      uVar17 = (ulong)(uVar20 - (int)*(char *)(lVar1 + 0x1a2));
      uVar23 = (rect->y2).m_i;
      uVar13 = uVar23 - (int)*(char *)(lVar1 + 0x1a3);
    }
    iVar16 = (int)uVar17 + 1;
    iVar18 = iVar16 - uVar14;
    iVar22 = (uVar13 + 1) - uVar15;
    iVar21 = ~uVar20 + (int)uVar11 + iVar18;
    iVar24 = ~uVar23 + uVar10 + iVar22;
    iVar4 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[4])(this);
    iVar3 = iVar21 + iVar4;
    if (iVar18 < iVar21 + iVar4) {
      iVar3 = iVar18;
    }
    iVar4 = extraout_var + iVar24;
    if (iVar22 < extraout_var + iVar24) {
      iVar4 = iVar22;
    }
    iVar8 = iVar4;
    if (((this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff) != 0) {
      RVar5.m_i = (*(this->super_QLayoutItem)._vptr_QLayoutItem[2])(this);
      QVar6 = QWidget::sizePolicy(this->wid);
      if (((uint)QVar6.field_0 & 0xf0000) == 0xd0000) {
        iVar7 = (**(code **)(*(long *)this->wid + 0x70))();
        QVar12 = QWidget::minimumSize(this->wid);
        RVar5.m_i = QVar12.wd.m_i.m_i;
        if (QVar12.wd.m_i.m_i < iVar7) {
          RVar5.m_i = iVar7;
        }
      }
      RVar19.m_i = extraout_var_00;
      if (((uint)QVar6.field_0 & 0xf00000) == 0xd00000) {
        (**(code **)(*(long *)this->wid + 0x70))();
        QVar12 = QWidget::minimumSize(this->wid);
        RVar19 = QVar12.ht.m_i;
        if (RVar19.m_i < extraout_var_01) {
          RVar19.m_i = extraout_var_01;
        }
      }
      uVar10 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i;
      iVar7 = RVar5.m_i + iVar21;
      if (iVar3 < RVar5.m_i + iVar21) {
        iVar7 = iVar3;
      }
      if ((uVar10 & 0x1f) == 0) {
        iVar7 = iVar3;
      }
      iVar3 = iVar7;
      if ((uVar10 & 0x1e0) != 0) {
        iVar8 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[9])(this);
        if ((char)iVar8 == '\0') {
          iVar8 = RVar19.m_i + iVar24;
          if (iVar4 < RVar19.m_i + iVar24) {
            iVar8 = iVar4;
          }
        }
        else {
          iVar21 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[10])
                             (this,(ulong)(uint)(iVar3 - iVar21));
          iVar8 = iVar21 + iVar24;
          if (iVar4 < iVar21 + iVar24) {
            iVar8 = iVar4;
          }
        }
      }
    }
    direction = QWidget::layoutDirection(this->wid);
    AVar9 = QStyle::visualAlignment
                      (direction,
                       (Alignment)
                       (this->super_QLayoutItem).align.
                       super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i);
    if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
      if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
        uVar14 = uVar14 + (iVar18 - iVar3) / 2;
      }
    }
    else {
      uVar14 = iVar16 - iVar3;
    }
    uVar10 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if ((uVar10 & 0x40) == 0) {
      if ((uVar10 & 0x20) == 0) {
        uVar15 = uVar15 + (iVar22 - iVar8) / 2;
      }
    }
    else {
      uVar15 = (uVar13 + 1) - iVar8;
    }
    uVar10 = (int)uVar14 >> 0x1f & uVar14;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_48.y1.m_i = 0;
    if (0 < (int)uVar15) {
      local_48.y1.m_i = uVar15;
    }
    local_48.x2.m_i = uVar10 + iVar3 + uVar14 + -1;
    local_48.y2.m_i = ((int)uVar15 >> 0x1f & uVar15) + iVar8 + local_48.y1.m_i + -1;
    local_48.x1.m_i = uVar14;
    QWidget::setGeometry(this->wid,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetItem::setGeometry(const QRect &rect)
{
    if (isEmpty())
        return;

    QRect r = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
            ? fromLayoutItemRect(wid->d_func(), rect)
            : rect;
    const QSize widgetRectSurplus = r.size() - rect.size();

    /*
       For historical reasons, this code is done using widget rect
       coordinates, not layout item rect coordinates. However,
       QWidgetItem's sizeHint(), maximumSize(), and heightForWidth()
       all work in terms of layout item rect coordinates, so we have to
       add or subtract widgetRectSurplus here and there. The code could
       be much simpler if we did everything using layout item rect
       coordinates and did the conversion right before the call to
       QWidget::setGeometry().
     */

    QSize s = r.size().boundedTo(maximumSize() + widgetRectSurplus);
    int x = r.x();
    int y = r.y();
    if (align & (Qt::AlignHorizontal_Mask | Qt::AlignVertical_Mask)) {
        QSize pref(sizeHint());
        QSizePolicy sp = wid->sizePolicy();
        if (sp.horizontalPolicy() == QSizePolicy::Ignored)
            pref.setWidth(wid->sizeHint().expandedTo(wid->minimumSize()).width());
        if (sp.verticalPolicy() == QSizePolicy::Ignored)
            pref.setHeight(wid->sizeHint().expandedTo(wid->minimumSize()).height());
        pref += widgetRectSurplus;
        if (align & Qt::AlignHorizontal_Mask)
            s.setWidth(qMin(s.width(), pref.width()));
        if (align & Qt::AlignVertical_Mask) {
            if (hasHeightForWidth())
                s.setHeight(qMin(s.height(),
                                 heightForWidth(s.width() - widgetRectSurplus.width())
                                 + widgetRectSurplus.height()));
            else
                s.setHeight(qMin(s.height(), pref.height()));
        }
    }
    Qt::Alignment alignHoriz = QStyle::visualAlignment(wid->layoutDirection(), align);
    if (alignHoriz & Qt::AlignRight)
        x = x + (r.width() - s.width());
    else if (!(alignHoriz & Qt::AlignLeft))
        x = x + (r.width() - s.width()) / 2;

    if (align & Qt::AlignBottom)
        y = y + (r.height() - s.height());
    else if (!(align & Qt::AlignTop))
        y = y + (r.height() - s.height()) / 2;

    // Make sure we don't move outside of the parent, e.g when styles demand
    // surplus space that exceeds the available margins (f.ex macOS with QGroupBox)
    if (x < 0) {
        s.rwidth() += x;
        x = 0;
    }
    if (y < 0) {
        s.rheight() += y;
        y = 0;
    }

    wid->setGeometry(x, y, s.width(), s.height());
}